

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

int32 vector_is_nan(float32 *vec,int32 len)

{
  int local_20;
  int result;
  int32 i;
  int32 len_local;
  float32 *vec_local;
  
  local_20 = 0;
  while( true ) {
    if (len <= local_20) {
      return 0;
    }
    if (NAN((float)vec[local_20])) break;
    local_20 = local_20 + 1;
  }
  return 1;
}

Assistant:

int32
vector_is_nan(float32 * vec, int32 len)
{
    int32 i;
    int result;
    for (i = 0; i < len; i++) {
#if defined(WIN32)
        result = _isnan(vec[i]);
#else
        result = isnan(vec[i]);
#endif
	if (result)
	    return 1;
    }
    return 0;
}